

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  uint32_t *puVar6;
  HasherCommon *pHVar7;
  int iVar8;
  bool bVar9;
  Command_conflict *pCVar10;
  uint32_t uVar11;
  int iVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint8_t *puVar19;
  long lVar20;
  byte bVar21;
  int *piVar22;
  uint8_t *puVar23;
  BrotliEncoderDictionary *pBVar24;
  uint8_t *local_b48;
  uint8_t *local_b38;
  uint8_t *local_b28;
  uint8_t *local_b20;
  uint8_t *local_b10;
  uint8_t *local_af8;
  uint8_t *local_ae8;
  uint8_t *local_ae0;
  ulong local_ad8;
  ulong local_ad0;
  uint8_t *local_ac0;
  uint8_t *local_ab8;
  uint8_t *local_ab0;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_a40;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command_conflict *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H2 *privat;
  BrotliEncoderParams *params_local;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t score_4;
  size_t len_3;
  size_t backward_2;
  size_t score_3;
  size_t len_2;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t key_2;
  int compare_char_1;
  size_t cur_ix_masked_1;
  size_t best_len_in_1;
  uint32_t *buckets_1;
  size_t score_1;
  size_t len_1;
  size_t backward;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t key;
  int compare_char;
  size_t cur_ix_masked;
  size_t best_len_in;
  uint32_t *buckets;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_6b8;
  uint32_t delta;
  uint8_t *local_648;
  size_t i_2;
  uint32_t key_4;
  uint32_t key_6;
  uint32_t key_5;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_578;
  size_t local_568;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_538;
  size_t local_528;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_4f8;
  size_t local_4e8;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_4b8;
  size_t local_4a8;
  int item_matches;
  size_t i;
  size_t key_1;
  int item_matches_1;
  size_t i_1;
  size_t key_3;
  uint32_t h_1;
  uint32_t h;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_3;
  size_t matchlen_1;
  size_t offset_1;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_270;
  size_t local_260;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_1;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_180;
  size_t local_170;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_7a;
  uint32_t nbits_2;
  ushort local_52;
  uint32_t offset_3;
  uint16_t bits64;
  ushort local_2a;
  
  pCVar10 = commands;
  puVar13 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  sVar5 = params->stream_offset;
  pos_end = *last_insert_len;
  puVar14 = (uint8_t *)(position + num_bytes);
  local_ab0 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_ab0 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar12 = 0x200;
  if (params->quality < 9) {
    iVar12 = 0x40;
  }
  lVar15 = (long)iVar12;
  gap = position + lVar15;
  puVar19 = (uint8_t *)position;
LAB_00124a58:
  do {
    ringbuffer_local = puVar19;
    if (puVar14 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar14 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar10 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar14 - (long)ringbuffer_local;
    local_ab8 = puVar13;
    if (ringbuffer_local < puVar13) {
      local_ab8 = ringbuffer_local;
    }
    local_ac0 = puVar13;
    if (ringbuffer_local + sVar5 < puVar13) {
      local_ac0 = ringbuffer_local + sVar5;
    }
    sr.len = 0;
    sr.distance = 0x7e4;
    sr.score = 0;
    pBVar24 = &params->dictionary;
    puVar19 = (uint8_t *)(params->dist).max_distance;
    puVar6 = (hasher->privat)._H2.buckets_;
    uVar16 = (ulong)ringbuffer_local & ringbuffer_mask;
    uVar1 = ringbuffer[uVar16];
    uVar11 = HashBytesH2(ringbuffer + uVar16);
    sStack_a40 = 0;
    sr.score._0_4_ = 0;
    iVar12 = *dist_cache;
    if ((ringbuffer_local + -(long)iVar12 < ringbuffer_local) &&
       (uVar17 = ringbuffer_mask & 0xffffffff & (ulong)(ringbuffer_local + -(long)iVar12),
       uVar1 == ringbuffer[uVar17])) {
      local_578 = (ulong *)(ringbuffer + uVar16);
      limit2 = 0;
      x = (max_distance >> 3) + 1;
LAB_00124dc7:
      x = x - 1;
      if (x != 0) {
        if (*local_578 == *(ulong *)(ringbuffer + limit2 + uVar17)) break;
        iVar8 = 0;
        for (uVar17 = *local_578 ^ *(ulong *)(ringbuffer + limit2 + uVar17); (uVar17 & 1) == 0;
            uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          iVar8 = iVar8 + 1;
        }
        local_568 = ((ulong)(long)iVar8 >> 3) + limit2;
        goto LAB_00124f6a;
      }
      matched = (max_distance & 7) + 1;
      while (matched = matched - 1, matched != 0) {
        if (ringbuffer[limit2 + uVar17] != (uint8_t)*local_578) {
          local_568 = limit2;
          goto LAB_00124f6a;
        }
        local_578 = (ulong *)((long)local_578 + 1);
        limit2 = limit2 + 1;
      }
      local_568 = limit2;
LAB_00124f6a:
      if ((local_568 < 4) || (uVar17 = local_568 * 0x87 + 0x78f, uVar17 < 0x7e5)) goto LAB_0012501a;
      sStack_a40 = local_568;
      puVar6[uVar11] = (uint32_t)ringbuffer_local;
      sr.len = (long)iVar12;
      sr.distance = uVar17;
    }
    else {
LAB_0012501a:
      uVar3 = puVar6[uVar11];
      puVar6[uVar11] = (uint32_t)ringbuffer_local;
      puVar23 = ringbuffer_local + -(ulong)uVar3;
      uVar17 = ringbuffer_mask & 0xffffffff & (ulong)uVar3;
      if ((uVar1 == ringbuffer[uVar17]) && (puVar23 != (uint8_t *)0x0 && puVar23 <= local_ab8)) {
        local_538 = (ulong *)(ringbuffer + uVar16);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_00125133:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_538 == *(ulong *)(ringbuffer + limit2_1 + uVar17)) goto LAB_00125195;
          iVar12 = 0;
          for (uVar17 = *local_538 ^ *(ulong *)(ringbuffer + limit2_1 + uVar17); (uVar17 & 1) == 0;
              uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            iVar12 = iVar12 + 1;
          }
          local_528 = ((ulong)(long)iVar12 >> 3) + limit2_1;
          goto LAB_001252d6;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar17] != (uint8_t)*local_538) {
            local_528 = limit2_1;
            goto LAB_001252d6;
          }
          local_538 = (ulong *)((long)local_538 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_528 = limit2_1;
LAB_001252d6:
        if (3 < local_528) {
          iVar12 = 0x1f;
          if ((uint)puVar23 != 0) {
            for (; (uint)puVar23 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          uVar17 = (local_528 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
          if (0x7e4 < uVar17) {
            sStack_a40 = local_528;
            sr.len = (size_t)puVar23;
            sr.distance = uVar17;
            goto LAB_001259e6;
          }
        }
        pHVar7 = (hasher->privat)._H2.common;
        piVar22 = (int *)(ringbuffer + uVar16);
        if (pHVar7->dict_num_lookups >> 7 <= pHVar7->dict_num_matches) {
          i = (size_t)(((uint)(*piVar22 * 0x1e35a7bd) >> 0x12) << 1);
          bVar9 = false;
          while (!bVar9) {
            pHVar7->dict_num_lookups = pHVar7->dict_num_lookups + 1;
            if ((params->dictionary).hash_table_lengths[i] != '\0') {
              bVar2 = (params->dictionary).hash_table_lengths[i];
              uVar17 = (ulong)bVar2;
              uVar16 = (ulong)(params->dictionary).hash_table_words[i];
              if (max_distance < uVar17) {
                bVar9 = false;
              }
              else {
                local_180 = (ulong *)(pBVar24->words->data +
                                     (ulong)pBVar24->words->offsets_by_length[uVar17] +
                                     uVar17 * uVar16);
                limit2_2 = 0;
                x_2 = (ulong)(bVar2 >> 3) + 1;
LAB_0012562f:
                x_2 = x_2 - 1;
                if (x_2 != 0) {
                  if (*local_180 == *(ulong *)((long)piVar22 + limit2_2)) goto LAB_00125691;
                  iVar12 = 0;
                  for (uVar18 = *local_180 ^ *(ulong *)((long)piVar22 + limit2_2); (uVar18 & 1) == 0
                      ; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                    iVar12 = iVar12 + 1;
                  }
                  local_170 = ((ulong)(long)iVar12 >> 3) + limit2_2;
                  goto LAB_001257d2;
                }
                matched_2 = (uVar17 & 7) + 1;
                while (matched_2 = matched_2 - 1, matched_2 != 0) {
                  if (*(char *)((long)piVar22 + limit2_2) != (char)*local_180) {
                    local_170 = limit2_2;
                    goto LAB_001257d2;
                  }
                  local_180 = (ulong *)((long)local_180 + 1);
                  limit2_2 = limit2_2 + 1;
                }
                local_170 = limit2_2;
LAB_001257d2:
                if ((uVar17 < local_170 + (params->dictionary).cutoffTransformsCount) &&
                   (local_170 != 0)) {
                  puVar23 = local_ac0 +
                            ((uVar17 - local_170) * 4 +
                             ((params->dictionary).cutoffTransforms >>
                              ((char)(uVar17 - local_170) * '\x06' & 0x3fU) & 0x3f) <<
                            (pBVar24->words->size_bits_by_length[uVar17] & 0x3f)) + uVar16 + 1;
                  if (puVar19 < puVar23) {
                    bVar9 = false;
                  }
                  else {
                    iVar12 = 0x1f;
                    if ((uint)puVar23 != 0) {
                      for (; (uint)puVar23 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                      }
                    }
                    uVar16 = (local_170 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                    if (uVar16 < sr.distance) {
                      bVar9 = false;
                    }
                    else {
                      sStack_a40 = local_170;
                      sr.score._0_4_ = (uint)bVar2 - (int)local_170;
                      bVar9 = true;
                      sr.len = (size_t)puVar23;
                      sr.distance = uVar16;
                    }
                  }
                }
                else {
                  bVar9 = false;
                }
              }
              if (bVar9) {
                pHVar7->dict_num_matches = pHVar7->dict_num_matches + 1;
              }
            }
            i = i + 1;
            bVar9 = true;
          }
        }
      }
    }
LAB_001259e6:
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      puVar19 = ringbuffer_local;
      if (sr.score._4_4_ == 0) {
        do {
          max_distance = max_distance - 1;
          if (params->quality < 5) {
            local_ad0 = sStack_a40 - 1;
            if (max_distance <= local_ad0) {
              local_ad0 = max_distance;
            }
            local_ad8 = local_ad0;
          }
          else {
            local_ad8 = 0;
          }
          sr2.len = 0;
          sr2.distance = 0x7e4;
          local_ae0 = puVar13;
          if (ringbuffer_local + 1 < puVar13) {
            local_ae0 = ringbuffer_local + 1;
          }
          local_ae8 = puVar13;
          if (ringbuffer_local + sVar5 + 1 < puVar13) {
            local_ae8 = ringbuffer_local + sVar5 + 1;
          }
          pBVar24 = &params->dictionary;
          puVar23 = ringbuffer_local + 1;
          puVar19 = (uint8_t *)(params->dist).max_distance;
          puVar6 = (hasher->privat)._H2.buckets_;
          uVar16 = (ulong)puVar23 & ringbuffer_mask;
          uVar1 = ringbuffer[uVar16 + local_ad8];
          uVar11 = HashBytesH2(ringbuffer + uVar16);
          distance_code = 0;
          sr2.score._0_4_ = 0;
          iVar12 = *dist_cache;
          if ((puVar23 + -(long)iVar12 < puVar23) &&
             (uVar17 = ringbuffer_mask & 0xffffffff & (ulong)(puVar23 + -(long)iVar12),
             uVar1 == ringbuffer[uVar17 + local_ad8])) {
            local_4f8 = (ulong *)(ringbuffer + uVar16);
            limit2_3 = 0;
            x_3 = (max_distance >> 3) + 1;
LAB_00125df4:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              if (*local_4f8 == *(ulong *)(ringbuffer + limit2_3 + uVar17)) goto LAB_00125e56;
              iVar8 = 0;
              for (uVar17 = *local_4f8 ^ *(ulong *)(ringbuffer + limit2_3 + uVar17);
                  (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                iVar8 = iVar8 + 1;
              }
              local_4e8 = ((ulong)(long)iVar8 >> 3) + limit2_3;
              goto LAB_00125f97;
            }
            matched_3 = (max_distance & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (ringbuffer[limit2_3 + uVar17] != (uint8_t)*local_4f8) {
                local_4e8 = limit2_3;
                goto LAB_00125f97;
              }
              local_4f8 = (ulong *)((long)local_4f8 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_4e8 = limit2_3;
LAB_00125f97:
            if ((local_4e8 < 4) || (uVar17 = local_4e8 * 0x87 + 0x78f, uVar17 < 0x7e5))
            goto LAB_00126047;
            distance_code = local_4e8;
            puVar6[uVar11] = (uint32_t)puVar23;
            sr2.len = (long)iVar12;
            sr2.distance = uVar17;
          }
          else {
LAB_00126047:
            uVar3 = puVar6[uVar11];
            puVar6[uVar11] = (uint32_t)puVar23;
            puVar23 = puVar23 + -(ulong)uVar3;
            uVar17 = ringbuffer_mask & 0xffffffff & (ulong)uVar3;
            if ((uVar1 == ringbuffer[uVar17 + local_ad8]) &&
               (puVar23 != (uint8_t *)0x0 && puVar23 <= local_ae0)) {
              local_4b8 = (ulong *)(ringbuffer + uVar16);
              limit2_4 = 0;
              x_4 = (max_distance >> 3) + 1;
LAB_00126160:
              x_4 = x_4 - 1;
              if (x_4 != 0) {
                if (*local_4b8 == *(ulong *)(ringbuffer + limit2_4 + uVar17)) goto LAB_001261c2;
                iVar12 = 0;
                for (uVar17 = *local_4b8 ^ *(ulong *)(ringbuffer + limit2_4 + uVar17);
                    (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                  iVar12 = iVar12 + 1;
                }
                local_4a8 = ((ulong)(long)iVar12 >> 3) + limit2_4;
                goto LAB_00126303;
              }
              matched_4 = (max_distance & 7) + 1;
              while (matched_4 = matched_4 - 1, matched_4 != 0) {
                if (ringbuffer[limit2_4 + uVar17] != (uint8_t)*local_4b8) {
                  local_4a8 = limit2_4;
                  goto LAB_00126303;
                }
                local_4b8 = (ulong *)((long)local_4b8 + 1);
                limit2_4 = limit2_4 + 1;
              }
              local_4a8 = limit2_4;
LAB_00126303:
              if (3 < local_4a8) {
                iVar12 = 0x1f;
                if ((uint)puVar23 != 0) {
                  for (; (uint)puVar23 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                  }
                }
                uVar17 = (local_4a8 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                if (0x7e4 < uVar17) {
                  distance_code = local_4a8;
                  sr2.len = (size_t)puVar23;
                  sr2.distance = uVar17;
                  goto LAB_00126a13;
                }
              }
              pHVar7 = (hasher->privat)._H2.common;
              piVar22 = (int *)(ringbuffer + uVar16);
              if (pHVar7->dict_num_lookups >> 7 <= pHVar7->dict_num_matches) {
                i_1 = (size_t)(((uint)(*piVar22 * 0x1e35a7bd) >> 0x12) << 1);
                bVar9 = false;
                while (!bVar9) {
                  pHVar7->dict_num_lookups = pHVar7->dict_num_lookups + 1;
                  if ((params->dictionary).hash_table_lengths[i_1] != '\0') {
                    bVar2 = (params->dictionary).hash_table_lengths[i_1];
                    uVar17 = (ulong)bVar2;
                    uVar16 = (ulong)(params->dictionary).hash_table_words[i_1];
                    if (max_distance < uVar17) {
                      bVar9 = false;
                    }
                    else {
                      local_270 = (ulong *)(pBVar24->words->data +
                                           (ulong)pBVar24->words->offsets_by_length[uVar17] +
                                           uVar17 * uVar16);
                      limit2_5 = 0;
                      x_5 = (ulong)(bVar2 >> 3) + 1;
LAB_0012665c:
                      x_5 = x_5 - 1;
                      if (x_5 != 0) {
                        if (*local_270 == *(ulong *)((long)piVar22 + limit2_5)) goto LAB_001266be;
                        iVar12 = 0;
                        for (uVar18 = *local_270 ^ *(ulong *)((long)piVar22 + limit2_5);
                            (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                          iVar12 = iVar12 + 1;
                        }
                        local_260 = ((ulong)(long)iVar12 >> 3) + limit2_5;
                        goto LAB_001267ff;
                      }
                      matched_5 = (uVar17 & 7) + 1;
                      while (matched_5 = matched_5 - 1, matched_5 != 0) {
                        if (*(char *)((long)piVar22 + limit2_5) != (char)*local_270) {
                          local_260 = limit2_5;
                          goto LAB_001267ff;
                        }
                        local_270 = (ulong *)((long)local_270 + 1);
                        limit2_5 = limit2_5 + 1;
                      }
                      local_260 = limit2_5;
LAB_001267ff:
                      if ((uVar17 < local_260 + (params->dictionary).cutoffTransformsCount) &&
                         (local_260 != 0)) {
                        puVar23 = local_ae8 +
                                  ((uVar17 - local_260) * 4 +
                                   ((params->dictionary).cutoffTransforms >>
                                    ((char)(uVar17 - local_260) * '\x06' & 0x3fU) & 0x3f) <<
                                  (pBVar24->words->size_bits_by_length[uVar17] & 0x3f)) + uVar16 + 1
                        ;
                        if (puVar19 < puVar23) {
                          bVar9 = false;
                        }
                        else {
                          iVar12 = 0x1f;
                          if ((uint)puVar23 != 0) {
                            for (; (uint)puVar23 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                            }
                          }
                          uVar16 = (local_260 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                          if (uVar16 < sr2.distance) {
                            bVar9 = false;
                          }
                          else {
                            distance_code = local_260;
                            sr2.score._0_4_ = (uint)bVar2 - (int)local_260;
                            bVar9 = true;
                            sr2.len = (size_t)puVar23;
                            sr2.distance = uVar16;
                          }
                        }
                      }
                      else {
                        bVar9 = false;
                      }
                    }
                    if (bVar9) {
                      pHVar7->dict_num_matches = pHVar7->dict_num_matches + 1;
                    }
                  }
                  i_1 = i_1 + 1;
                  bVar9 = true;
                }
              }
            }
          }
LAB_00126a13:
          puVar19 = ringbuffer_local;
          if (sr2.distance < sr.distance + 0xaf) break;
          puVar19 = ringbuffer_local + 1;
          pos_end = pos_end + 1;
          sStack_a40 = distance_code;
          sr.len = sr2.len;
          sr.distance = sr2.distance;
          sr.score = (size_t)(uint)sr2.score;
          cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
          if ((3 < cost_diff_lazy._4_4_) ||
             (puVar23 = ringbuffer_local + 9, ringbuffer_local = puVar19, puVar14 <= puVar23))
          break;
        } while( true );
      }
      ringbuffer_local = puVar19;
      gap = (size_t)(ringbuffer_local + lVar15 + sStack_a40 * 2);
      local_af8 = puVar13;
      if (ringbuffer_local + sVar5 < puVar13) {
        local_af8 = ringbuffer_local + sVar5;
      }
      if (local_af8 < sr.len) {
LAB_00126cf2:
        local_6b8 = sr.len + 0xf;
      }
      else {
        uVar16 = (sr.len + 3) - (long)*dist_cache;
        uVar17 = (sr.len + 3) - (long)dist_cache[1];
        if (sr.len == (long)*dist_cache) {
          local_6b8 = 0;
        }
        else if (sr.len == (long)dist_cache[1]) {
          local_6b8 = 1;
        }
        else if (uVar16 < 7) {
          local_6b8 = (ulong)(int)(0x9750468 >> ((byte)((uVar16 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (uVar17 < 7) {
          local_6b8 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar17 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (sr.len == (long)dist_cache[2]) {
          local_6b8 = 2;
        }
        else {
          if (sr.len != (long)dist_cache[3]) goto LAB_00126cf2;
          local_6b8 = 3;
        }
      }
      if ((sr.len <= local_af8) && (local_6b8 != 0)) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = *dist_cache;
        *dist_cache = (int)sr.len;
      }
      uVar11 = (uint32_t)pos_end;
      commands->insert_len_ = uVar11;
      commands->copy_len_ = (uint)sStack_a40 | (int)sr.score << 0x19;
      uVar3 = (params->dist).num_direct_distance_codes;
      uVar4 = (params->dist).distance_postfix_bits;
      if (local_6b8 < (ulong)uVar3 + 0x10) {
        commands->dist_prefix_ = (uint16_t)local_6b8;
        commands->dist_extra_ = 0;
      }
      else {
        bVar2 = (byte)uVar4;
        uVar16 = (1L << (bVar2 + 2 & 0x3f)) + ((local_6b8 - 0x10) - (ulong)uVar3);
        iVar12 = 0x1f;
        if ((uint)uVar16 != 0) {
          for (; (uint)uVar16 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        bVar21 = (byte)(iVar12 - 1U);
        uVar17 = uVar16 >> (bVar21 & 0x3f) & 1;
        lVar20 = (ulong)(iVar12 - 1U) - (ulong)uVar4;
        commands->dist_prefix_ =
             (short)lVar20 * 0x400 |
             (short)uVar3 + 0x10 + (short)((lVar20 + -1) * 2 + uVar17 << (bVar2 & 0x3f)) +
             ((ushort)uVar16 & (short)(1 << (bVar2 & 0x1f)) - 1U);
        commands->dist_extra_ =
             (uint32_t)(uVar16 - (uVar17 + 2 << (bVar21 & 0x3f)) >> (bVar2 & 0x3f));
      }
      iVar12 = (uint)sStack_a40 + (int)sr.score;
      uVar16 = (ulong)iVar12;
      if (pos_end < 6) {
        local_7a = (ushort)pos_end;
      }
      else if (pos_end < 0x82) {
        iVar8 = 0x1f;
        if (uVar11 - 2 != 0) {
          for (; uVar11 - 2 >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_7a = (short)(iVar8 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar8 + -1) & 0x3f)) + 2
        ;
      }
      else if (pos_end < 0x842) {
        iVar8 = 0x1f;
        if (uVar11 - 0x42 != 0) {
          for (; uVar11 - 0x42 >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_7a = (short)iVar8 + 10;
      }
      else if (pos_end < 0x1842) {
        local_7a = 0x15;
      }
      else if (pos_end < 0x5842) {
        local_7a = 0x16;
      }
      else {
        local_7a = 0x17;
      }
      if (uVar16 < 10) {
        local_52 = (short)iVar12 - 2;
      }
      else if (uVar16 < 0x86) {
        iVar8 = 0x1f;
        if (iVar12 - 6U != 0) {
          for (; iVar12 - 6U >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_52 = (short)(iVar8 + -1) * 2 + (short)(uVar16 - 6 >> ((byte)(iVar8 + -1) & 0x3f)) + 4;
      }
      else if (uVar16 < 0x846) {
        iVar8 = 0x1f;
        if (iVar12 - 0x46U != 0) {
          for (; iVar12 - 0x46U >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_52 = (short)iVar8 + 0xc;
      }
      else {
        local_52 = 0x17;
      }
      local_2a = local_52 & 7 | (local_7a & 7) << 3;
      if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_7a < 8)) && (local_52 < 0x10)) {
        if (7 < local_52) {
          local_2a = local_2a | 0x40;
        }
      }
      else {
        iVar12 = ((int)(uint)local_52 >> 3) + ((int)(uint)local_7a >> 3) * 3;
        local_2a = (short)iVar12 * 0x40 + 0x40 +
                   ((ushort)(0x520d40 >> ((char)iVar12 * '\x02' & 0x1fU)) & 0xc0) | local_2a;
      }
      commands->cmd_prefix_ = local_2a;
      *num_literals = pos_end + *num_literals;
      pos_end = 0;
      range_end = (size_t)(ringbuffer_local + 2);
      local_b10 = ringbuffer_local + sStack_a40;
      if (local_ab0 <= local_b10) {
        local_b10 = local_ab0;
      }
      if (sr.len < sStack_a40 >> 2) {
        local_b20 = ringbuffer_local + sr.len * -4 + sStack_a40;
        if (local_b20 < range_end) {
          local_b20 = (uint8_t *)range_end;
        }
        if (local_b10 < local_b20) {
          local_b28 = local_b10;
        }
        else {
          local_b28 = local_b20;
        }
        range_end = (size_t)local_b28;
      }
      for (local_648 = (uint8_t *)range_end; local_648 < local_b10; local_648 = local_648 + 1) {
        uVar11 = HashBytesH2(ringbuffer + ((ulong)local_648 & ringbuffer_mask));
        (hasher->privat)._H2.buckets_[uVar11] = (uint32_t)local_648;
      }
      commands = commands + 1;
      puVar19 = ringbuffer_local + sStack_a40;
      goto LAB_00124a58;
    }
    pos_end = pos_end + 1;
    puVar19 = ringbuffer_local + 1;
    if ((gap < puVar19) && (back_refs_size == 0)) {
      if ((uint8_t *)(gap + lVar15 * 4) < puVar19) {
        puVar23 = ringbuffer_local + 0x11;
        local_b38 = puVar14 + -7;
        ringbuffer_local = puVar19;
        if (puVar23 < local_b38) {
          local_b38 = puVar23;
        }
        for (; puVar19 = ringbuffer_local, ringbuffer_local < local_b38;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar11 = HashBytesH2(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          (hasher->privat)._H2.buckets_[uVar11] = (uint32_t)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar23 = ringbuffer_local + 9;
        local_b48 = puVar14 + -7;
        ringbuffer_local = puVar19;
        if (puVar23 < local_b48) {
          local_b48 = puVar23;
        }
        for (; puVar19 = ringbuffer_local, ringbuffer_local < local_b48;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar11 = HashBytesH2(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          (hasher->privat)._H2.buckets_[uVar11] = (uint32_t)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
  local_578 = local_578 + 1;
  limit2 = limit2 + 8;
  goto LAB_00124dc7;
LAB_00125195:
  local_538 = local_538 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00125133;
LAB_00125691:
  local_180 = local_180 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0012562f;
LAB_00125e56:
  local_4f8 = local_4f8 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00125df4;
LAB_001261c2:
  local_4b8 = local_4b8 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_00126160;
LAB_001266be:
  local_270 = local_270 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_0012665c;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}